

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

ktx_size_t ktxTexture_doCalcFaceLodSize(ktxTexture *This,ktx_uint32_t level,ktxFormatVersionEnum fv)

{
  ktxFormatVersionEnum in_EDX;
  ktx_uint32_t in_ESI;
  ktxTexture *in_RDI;
  ktxFormatVersionEnum in_stack_00000010;
  ktx_uint32_t in_stack_00000014;
  ktxTexture *in_stack_00000018;
  ktx_size_t local_8;
  
  if (((in_RDI->isCubemap & 1U) == 0) || ((in_RDI->isArray & 1U) != 0)) {
    local_8 = ktxTexture_calcLevelSize(in_RDI,in_ESI,in_EDX);
  }
  else {
    local_8 = ktxTexture_calcImageSize(in_stack_00000018,in_stack_00000014,in_stack_00000010);
  }
  return local_8;
}

Assistant:

ktx_size_t
ktxTexture_doCalcFaceLodSize(ktxTexture* This, ktx_uint32_t level,
                             ktxFormatVersionEnum fv)
{
    /*
     * For non-array cubemaps this is the size of a face. For everything
     * else it is the size of the level.
     */
    if (This->isCubemap && !This->isArray)
        return ktxTexture_calcImageSize(This, level, fv);
    else
        return ktxTexture_calcLevelSize(This, level, fv);
}